

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

bool __thiscall iDynTree::Model::isFrameNameUsed(Model *this,string *frameName)

{
  __type _Var1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i_1;
  size_t i;
  Model *in_stack_ffffffffffffffb0;
  ulong local_28;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = getNrOfLinks((Model *)0x4499ea);
    if (sVar2 <= local_20) {
      local_28 = getNrOfLinks((Model *)0x449a43);
      while( true ) {
        sVar2 = getNrOfFrames(in_stack_ffffffffffffffb0);
        if (sVar2 <= local_28) {
          return false;
        }
        in_stack_ffffffffffffffb0 = (Model *)((long)&in_RDI[4].field_2 + 8);
        sVar2 = getNrOfLinks((Model *)0x449a8a);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffffb0,local_28 - sVar2);
        _Var1 = std::operator==(in_RDI,in_RSI);
        if (_Var1) break;
        local_28 = local_28 + 1;
      }
      return true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[3]._M_string_length,local_20);
    _Var1 = std::operator==(in_RDI,in_RSI);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool Model::isFrameNameUsed(const std::string frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return true;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return true;
        }
    }

    return false;
}